

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

unique_ptr<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_> __thiscall
flatbuffers::FlatCompiler::GenerateCode
          (FlatCompiler *this,FlatCOptions *options,Parser *conform_parser)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *filepath;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  long lVar3;
  long lVar4;
  long *plVar5;
  _Alloc_hider buffer;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  Parser *pPVar12;
  size_t sVar13;
  Parser *in_RCX;
  long *plVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  _Base_ptr __rhs;
  Reference RVar16;
  byte local_50c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reuse_tracker;
  string filebase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  _Base_ptr *local_460;
  ulong local_458;
  uint8_t *local_450;
  Parser *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  IDLOptions opts;
  
  local_448 = in_RCX;
  pPVar12 = (Parser *)operator_new(0x780);
  Parser::Parser(pPVar12,(IDLOptions *)conform_parser);
  *(Parser **)&(this->code_generators_)._M_t._M_impl = pPVar12;
  __rhs = (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_460 = &(conform_parser->files_included_per_file_)._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent;
  filepath = &(conform_parser->file_extension_).field_2;
  do {
    if (__rhs == (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left) {
      return (__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
              )(__uniq_ptr_data<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>,_true,_true>
                )this;
    }
    IDLOptions::IDLOptions(&opts,(IDLOptions *)conform_parser);
    contents._M_dataplus._M_p = (pointer)&contents.field_2;
    contents._M_string_length = 0;
    contents.field_2._M_local_buf[0] = '\0';
    bVar7 = LoadFile(*(char **)__rhs,true,&contents);
    if (!bVar7) {
      std::operator+(&ext,"unable to load file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)(options,&ext,1);
      std::__cxx11::string::~string((string *)&ext);
    }
    p_Var1 = (conform_parser->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    p_Var2 = (conform_parser->known_attributes_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_right;
    GetExtension(&ext,(string *)__rhs);
    bVar7 = std::operator==(&ext,"fbs");
    if ((bVar7) || (bVar7 = std::operator==(&ext,"proto"), bVar7)) {
      local_50c = 1;
      if (opts.project_root._M_string_length == 0) {
        StripFileName(&filebase,(string *)__rhs);
        std::__cxx11::string::operator=((string *)&opts.project_root,(string *)&filebase);
        std::__cxx11::string::~string((string *)&filebase);
      }
    }
    else {
      local_50c = 0;
    }
    bVar7 = std::operator==(&ext,"bfbs");
    sVar6 = contents._M_string_length;
    if ((_Base_ptr)((long)__rhs - (long)p_Var1 >> 5) < p_Var2) {
      if ((opts.use_flexbuffers == false && !bVar7) &&
         (sVar13 = strlen(contents._M_dataplus._M_p), sVar6 != sVar13)) {
        std::operator+(&filebase,"input file appears to be binary: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)(options,&filebase,1);
        std::__cxx11::string::~string((string *)&filebase);
      }
      if ((local_50c | bVar7) == 1) {
        pPVar12 = (Parser *)operator_new(0x780);
        Parser::Parser(pPVar12,&opts);
        std::__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>::reset
                  ((__uniq_ptr_impl<flatbuffers::Parser,_std::default_delete<flatbuffers::Parser>_>
                    *)this,pPVar12);
      }
      sVar6 = contents._M_string_length;
      buffer._M_p = contents._M_dataplus._M_p;
      if (bVar7) {
        LoadBinarySchema((FlatCompiler *)options,*(Parser **)&(this->code_generators_)._M_t._M_impl,
                         (string *)__rhs,&contents);
LAB_00225e29:
        lVar3._0_1_ = (conform_parser->opts).gen_jvmstatic;
        lVar3._1_1_ = (conform_parser->opts).use_flexbuffers;
        lVar3._2_1_ = (conform_parser->opts).strict_json;
        lVar3._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
        lVar3._4_4_ = (conform_parser->opts).indent_step;
        if (lVar3 != 0) {
LAB_0022613c:
          Parser::ConformTo_abi_cxx11_
                    (&filebase,*(Parser **)&(this->code_generators_)._M_t._M_impl,local_448);
          if (filebase._M_string_length != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &reuse_tracker,"schemas don\'t conform: ",&filebase);
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &reuse_tracker,0,1);
            std::__cxx11::string::~string((string *)&reuse_tracker);
          }
          std::__cxx11::string::~string((string *)&filebase);
        }
      }
      else {
        if (opts.use_flexbuffers == true) {
          if (opts.lang_to_generate == 0x80) {
            reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar8 = flexbuffers::VerifyBuffer
                              ((uint8_t *)contents._M_dataplus._M_p,contents._M_string_length,
                               &reuse_tracker);
            if (!bVar8) {
              std::operator+(&filebase,"flexbuffers file failed to verify: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __rhs);
              (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                        (options,&filebase,0,1);
              std::__cxx11::string::~string((string *)&filebase);
            }
            RVar16 = flexbuffers::GetRoot((uint8_t *)buffer._M_p,sVar6);
            *(Reference *)(*(long *)&(this->code_generators_)._M_t._M_impl + 0x2e8) = RVar16;
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&reuse_tracker.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          }
          else {
            flexbuffers::Builder::Clear
                      ((Builder *)(*(long *)&(this->code_generators_)._M_t._M_impl + 0x248));
            ParseFile((FlatCompiler *)options,*(Parser **)&(this->code_generators_)._M_t._M_impl,
                      (string *)__rhs,&contents,
                      (vector<const_char_*,_std::allocator<const_char_*>_> *)local_460);
          }
        }
        else {
          ParseFile((FlatCompiler *)options,*(Parser **)&(this->code_generators_)._M_t._M_impl,
                    (string *)__rhs,&contents,
                    (vector<const_char_*,_std::allocator<const_char_*>_> *)local_460);
          if (local_50c != 0) goto LAB_00225e29;
          if (*(int *)(*(long *)&(this->code_generators_)._M_t._M_impl + 0x1f8) == 0) {
            std::operator+(&filebase,"input file is neither json nor a .fbs (schema) file: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&filebase,1);
            std::__cxx11::string::~string((string *)&filebase);
          }
        }
        lVar4._0_1_ = (conform_parser->opts).gen_jvmstatic;
        lVar4._1_1_ = (conform_parser->opts).use_flexbuffers;
        lVar4._2_1_ = (conform_parser->opts).strict_json;
        lVar4._3_1_ = (conform_parser->opts).output_default_scalars_in_json;
        lVar4._4_4_ = (conform_parser->opts).indent_step;
        if (((local_50c | bVar7) & lVar4 != 0) != 0) goto LAB_0022613c;
      }
      if ((*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 4)
           != '\0') || (bVar10 = 0, opts.binary_schema_gen_embed == true)) {
        Parser::Serialize(*(Parser **)&(this->code_generators_)._M_t._M_impl);
        bVar10 = *(byte *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p
                          + 4);
      }
      if ((bVar10 & 1) != 0) {
        std::__cxx11::string::assign
                  ((char *)(*(long *)&(this->code_generators_)._M_t._M_impl + 800));
      }
    }
    else {
      FlatBufferBuilderImpl<false>::Clear
                ((FlatBufferBuilderImpl<false> *)
                 (*(long *)&(this->code_generators_)._M_t._M_impl + 0x1c8));
      FlatBufferBuilderImpl<false>::PushFlatBuffer
                ((FlatBufferBuilderImpl<false> *)
                 (*(long *)&(this->code_generators_)._M_t._M_impl + 0x1c8),
                 (uint8_t *)contents._M_dataplus._M_p,contents._M_string_length);
      if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 3)
          == '\0') {
        lVar4 = *(long *)&(this->code_generators_)._M_t._M_impl;
        if (*(long *)(lVar4 + 0x308) == 0) {
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &reuse_tracker;
          std::operator+(pbVar15,"current schema has no file_identifier: cannot test if \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::operator+(&filebase,pbVar15,
                         "\" matches the schema, use --raw-binary to read this file anyway.");
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&filebase,1);
          std::__cxx11::string::~string((string *)&filebase);
        }
        else {
          bVar8 = BufferHasIdentifier(contents._M_dataplus._M_p,*(char **)(lVar4 + 0x300),
                                      opts.size_prefixed);
          if (bVar8) goto LAB_002261e9;
          std::operator+(&local_480,"binary \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          std::operator+(&local_4c0,&local_480,"\" does not have expected file_identifier \"");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reuse_tracker,&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)&(this->code_generators_)._M_t._M_impl + 0x300));
          std::operator+(&filebase,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reuse_tracker,"\", use --raw-binary to read this file anyway.");
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&filebase,1);
          std::__cxx11::string::~string((string *)&filebase);
          std::__cxx11::string::~string((string *)&reuse_tracker);
          std::__cxx11::string::~string((string *)&local_4c0);
          pbVar15 = &local_480;
        }
        std::__cxx11::string::~string((string *)pbVar15);
      }
    }
LAB_002261e9:
    StripExtension((string *)&reuse_tracker,(string *)__rhs);
    StripPath(&filebase,(string *)&reuse_tracker);
    std::__cxx11::string::~string((string *)&reuse_tracker);
    local_458 = 0;
    local_450 = (uint8_t *)0x0;
    if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 6) ==
        '\x01') {
      Parser::Serialize(*(Parser **)&(this->code_generators_)._M_t._M_impl);
      local_450 = FlatBufferBuilderImpl<false>::GetBufferPointer
                            ((FlatBufferBuilderImpl<false> *)
                             (*(long *)&(this->code_generators_)._M_t._M_impl + 0x1c8));
      local_458 = (ulong)*(uint *)(*(long *)&(this->code_generators_)._M_t._M_impl + 0x1f8);
    }
    plVar5 = (long *)(conform_parser->opts).cpp_object_api_string_type.field_2._M_allocated_capacity
    ;
    for (plVar14 = (long *)(conform_parser->opts).cpp_object_api_string_type._M_string_length;
        plVar14 != plVar5; plVar14 = plVar14 + 2) {
      if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 2)
          == '\x01') {
        reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&reuse_tracker.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)reuse_tracker.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        iVar11 = (**(code **)(*(long *)*plVar14 + 0x28))
                           ((long *)*plVar14,*(undefined8 *)&(this->code_generators_)._M_t._M_impl,
                            filepath,__rhs,&reuse_tracker);
        if ((iVar11 == 0) &&
           (reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0)) {
          std::__cxx11::string::string((string *)&local_380,(string *)&reuse_tracker);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0," ",(allocator<char> *)&local_480);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360," \\",(allocator<char> *)&local_440);
          WordWrap(&local_4c0,&local_380,0x50,&local_3a0,&local_360);
          puts(local_4c0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_380);
        }
        else {
          (**(code **)(*(long *)*plVar14 + 0x60))(&local_480);
          std::operator+(&local_4c0,"Cannot generate make rule for ",&local_480);
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,&local_4c0,1);
          std::__cxx11::string::~string((string *)&local_4c0);
          pbVar15 = &local_480;
LAB_00226520:
          std::__cxx11::string::~string((string *)pbVar15);
        }
LAB_00226525:
        pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &reuse_tracker;
LAB_0022652a:
        std::__cxx11::string::~string((string *)pbVar15);
      }
      else {
        EnsureDirExists((string *)filepath);
        cVar9 = (**(code **)(*(long *)*plVar14 + 0x48))();
        if (cVar9 != '\0') {
          reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&reuse_tracker.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          reuse_tracker.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)reuse_tracker.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          std::__cxx11::string::_M_assign((string *)&reuse_tracker);
          iVar11 = (**(code **)(*(long *)*plVar14 + 0x20))
                             ((long *)*plVar14,local_450,local_458,(string *)&reuse_tracker);
          if (iVar11 != 0) {
            (**(code **)(*(long *)*plVar14 + 0x60))(&local_3e0);
            std::operator+(&local_3c0,"Unable to generate ",&local_3e0);
            std::operator+(&local_420,&local_3c0," for ");
            std::operator+(&local_440,&local_420,&filebase);
            std::operator+(&local_480,&local_440,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*plVar14 + 8));
            std::operator+(&local_4c0,&local_480," using bfbs generator.");
            (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                      (options,&local_4c0,1);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::~string((string *)&local_420);
            std::__cxx11::string::~string((string *)&local_3c0);
            pbVar15 = &local_3e0;
            goto LAB_00226520;
          }
          goto LAB_00226525;
        }
        bVar10 = (**(code **)(*(long *)*plVar14 + 0x40))();
        if (((byte)(bVar7 | local_50c | bVar10 ^ 1) == 1) &&
           (iVar11 = (**(code **)(*(long *)*plVar14 + 0x10))
                               ((long *)*plVar14,
                                *(undefined8 *)&(this->code_generators_)._M_t._M_impl,filepath,
                                &filebase), iVar11 != 0)) {
          (**(code **)(*(long *)*plVar14 + 0x60))(&local_420);
          std::operator+(&local_440,"Unable to generate ",&local_420);
          std::operator+(&local_480,&local_440," for ");
          std::operator+(&local_4c0,&local_480,&filebase);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reuse_tracker,&local_4c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*plVar14 + 8));
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &reuse_tracker,1);
          std::__cxx11::string::~string((string *)&reuse_tracker);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_480);
          std::__cxx11::string::~string((string *)&local_440);
          pbVar15 = &local_420;
          goto LAB_0022652a;
        }
      }
      if (*(char *)((long)&(conform_parser->opts).cpp_object_api_string_type._M_dataplus._M_p + 5)
          == '\x01') {
        iVar11 = (**(code **)(*(long *)*plVar14 + 0x30))
                           ((long *)*plVar14,*(undefined8 *)&(this->code_generators_)._M_t._M_impl,
                            filepath,&filebase);
        if (iVar11 == 1) {
          (**(code **)(*(long *)*plVar14 + 0x60))(&local_4c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reuse_tracker,"Unable to generate GRPC interface for ",&local_4c0);
          (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                    (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &reuse_tracker,1);
        }
        else {
          if (iVar11 != 3) goto LAB_002266f1;
          (**(code **)(*(long *)*plVar14 + 0x60))(&local_4c0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &reuse_tracker,"GRPC interface generator not implemented for ",&local_4c0);
          (**(code **)((long)&(options->opts).cpp_object_api_pointer_type.field_2 + 8))
                    (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &reuse_tracker,1);
        }
        std::__cxx11::string::~string((string *)&reuse_tracker);
        std::__cxx11::string::~string((string *)&local_4c0);
      }
LAB_002266f1:
    }
    if (opts.root_type._M_string_length != 0) {
      bVar7 = Parser::SetRootType(*(Parser **)&(this->code_generators_)._M_t._M_impl,
                                  opts.root_type._M_dataplus._M_p);
      if (bVar7) {
        if (*(char *)(*(long *)(*(long *)&(this->code_generators_)._M_t._M_impl + 0x2f8) + 0x110) !=
            '\x01') goto LAB_0022679e;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&reuse_tracker,"root type must be a table",
                   (allocator<char> *)&local_4c0);
        (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                  (options,(string *)&reuse_tracker,1);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &reuse_tracker,"unknown root type: ",&opts.root_type);
        (*(code *)(options->opts).cpp_object_api_string_type._M_dataplus._M_p)
                  (options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &reuse_tracker,1);
      }
      std::__cxx11::string::~string((string *)&reuse_tracker);
    }
LAB_0022679e:
    Parser::MarkGenerated(*(Parser **)&(this->code_generators_)._M_t._M_impl);
    std::__cxx11::string::~string((string *)&filebase);
    std::__cxx11::string::~string((string *)&ext);
    std::__cxx11::string::~string((string *)&contents);
    IDLOptions::~IDLOptions(&opts);
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Parser> FlatCompiler::GenerateCode(const FlatCOptions &options,
                                                   Parser &conform_parser) {
  std::unique_ptr<Parser> parser =
      std::unique_ptr<Parser>(new Parser(options.opts));

  for (auto file_it = options.filenames.begin();
       file_it != options.filenames.end(); ++file_it) {
    IDLOptions opts = options.opts;

    auto &filename = *file_it;
    std::string contents;
    if (!flatbuffers::LoadFile(filename.c_str(), true, &contents))
      Error("unable to load file: " + filename);

    bool is_binary = static_cast<size_t>(file_it - options.filenames.begin()) >=
                     options.binary_files_from;
    auto ext = flatbuffers::GetExtension(filename);
    const bool is_schema = ext == "fbs" || ext == "proto";
    if (is_schema && opts.project_root.empty()) {
      opts.project_root = StripFileName(filename);
    }
    const bool is_binary_schema = ext == reflection::SchemaExtension();
    if (is_binary) {
      parser->builder_.Clear();
      parser->builder_.PushFlatBuffer(
          reinterpret_cast<const uint8_t *>(contents.c_str()),
          contents.length());
      if (!options.raw_binary) {
        // Generally reading binaries that do not correspond to the schema
        // will crash, and sadly there's no way around that when the binary
        // does not contain a file identifier.
        // We'd expect that typically any binary used as a file would have
        // such an identifier, so by default we require them to match.
        if (!parser->file_identifier_.length()) {
          Error("current schema has no file_identifier: cannot test if \"" +
                filename +
                "\" matches the schema, use --raw-binary to read this file"
                " anyway.");
        } else if (!flatbuffers::BufferHasIdentifier(
                       contents.c_str(), parser->file_identifier_.c_str(),
                       opts.size_prefixed)) {
          Error("binary \"" + filename +
                "\" does not have expected file_identifier \"" +
                parser->file_identifier_ +
                "\", use --raw-binary to read this file anyway.");
        }
      }
    } else {
      // Check if file contains 0 bytes.
      if (!opts.use_flexbuffers && !is_binary_schema &&
          contents.length() != strlen(contents.c_str())) {
        Error("input file appears to be binary: " + filename, true);
      }
      if (is_schema || is_binary_schema) {
        // If we're processing multiple schemas, make sure to start each
        // one from scratch. If it depends on previous schemas it must do
        // so explicitly using an include.
        parser.reset(new Parser(opts));
      }
      // Try to parse the file contents (binary schema/flexbuffer/textual
      // schema)
      if (is_binary_schema) {
        LoadBinarySchema(*parser, filename, contents);
      } else if (opts.use_flexbuffers) {
        if (opts.lang_to_generate == IDLOptions::kJson) {
          auto data = reinterpret_cast<const uint8_t *>(contents.c_str());
          auto size = contents.size();
          std::vector<uint8_t> reuse_tracker;
          if (!flexbuffers::VerifyBuffer(data, size, &reuse_tracker))
            Error("flexbuffers file failed to verify: " + filename, false);
          parser->flex_root_ = flexbuffers::GetRoot(data, size);
        } else {
          parser->flex_builder_.Clear();
          ParseFile(*parser, filename, contents, options.include_directories);
        }
      } else {
        ParseFile(*parser, filename, contents, options.include_directories);
        if (!is_schema && !parser->builder_.GetSize()) {
          // If a file doesn't end in .fbs, it must be json/binary. Ensure we
          // didn't just parse a schema with a different extension.
          Error("input file is neither json nor a .fbs (schema) file: " +
                    filename,
                true);
        }
      }
      if ((is_schema || is_binary_schema) &&
          !options.conform_to_schema.empty()) {
        auto err = parser->ConformTo(conform_parser);
        if (!err.empty()) Error("schemas don\'t conform: " + err, false);
      }
      if (options.schema_binary || opts.binary_schema_gen_embed) {
        parser->Serialize();
      }
      if (options.schema_binary) {
        parser->file_extension_ = reflection::SchemaExtension();
      }
    }
    std::string filebase =
        flatbuffers::StripPath(flatbuffers::StripExtension(filename));

    // If one of the generators uses bfbs, serialize the parser and get
    // the serialized buffer and length.
    const uint8_t *bfbs_buffer = nullptr;
    int64_t bfbs_length = 0;
    if (options.requires_bfbs) {
      parser->Serialize();
      bfbs_buffer = parser->builder_.GetBufferPointer();
      bfbs_length = parser->builder_.GetSize();
    }

    for (const std::shared_ptr<CodeGenerator> &code_generator :
         options.generators) {
      if (options.print_make_rules) {
        std::string make_rule;
        const CodeGenerator::Status status = code_generator->GenerateMakeRule(
            *parser, options.output_path, filename, make_rule);
        if (status == CodeGenerator::Status::OK && !make_rule.empty()) {
          printf("%s\n",
                 flatbuffers::WordWrap(make_rule, 80, " ", " \\").c_str());
        } else {
          Error("Cannot generate make rule for " +
                code_generator->LanguageName());
        }
      } else {
        flatbuffers::EnsureDirExists(options.output_path);

        // Prefer bfbs generators if present.
        if (code_generator->SupportsBfbsGeneration()) {
          CodeGenOptions code_gen_options;
          code_gen_options.output_path = options.output_path;

          const CodeGenerator::Status status = code_generator->GenerateCode(
              bfbs_buffer, bfbs_length, code_gen_options);
          if (status != CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail +
                  " using bfbs generator.");
          }
        } else {
          if ((!code_generator->IsSchemaOnly() ||
               (is_schema || is_binary_schema)) &&
              code_generator->GenerateCode(*parser, options.output_path,
                                           filebase) !=
                  CodeGenerator::Status::OK) {
            Error("Unable to generate " + code_generator->LanguageName() +
                  " for " + filebase + code_generator->status_detail);
          }
        }
      }

      if (options.grpc_enabled) {
        const CodeGenerator::Status status = code_generator->GenerateGrpcCode(
            *parser, options.output_path, filebase);

        if (status == CodeGenerator::Status::NOT_IMPLEMENTED) {
          Warn("GRPC interface generator not implemented for " +
               code_generator->LanguageName());
        } else if (status == CodeGenerator::Status::ERROR) {
          Error("Unable to generate GRPC interface for " +
                code_generator->LanguageName());
        }
      }
    }

    if (!opts.root_type.empty()) {
      if (!parser->SetRootType(opts.root_type.c_str()))
        Error("unknown root type: " + opts.root_type);
      else if (parser->root_struct_def_->fixed)
        Error("root type must be a table");
    }

    // We do not want to generate code for the definitions in this file
    // in any files coming up next.
    parser->MarkGenerated();
  }

  return parser;
}